

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O3

bool bssl::ssl_can_renegotiate(SSL *ssl)

{
  uint16_t uVar1;
  bool bVar2;
  
  if (((((ssl->field_0xa4 & 1) == 0) && (ssl->method->is_dtls == false)) &&
      ((ssl->s3->version == 0 || (uVar1 = ssl_protocol_version(ssl), uVar1 < 0x304)))) &&
     ((ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl != (SSL_CONFIG *)0x0)) {
    switch(ssl->renegotiate_mode) {
    case ssl_renegotiate_never:
    case ssl_renegotiate_ignore:
      goto switchD_00156128_caseD_0;
    case ssl_renegotiate_once:
      bVar2 = ssl->s3->total_renegotiations == 0;
      break;
    case ssl_renegotiate_freely:
    case ssl_renegotiate_explicit:
      bVar2 = true;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                    ,0x135,"bool bssl::ssl_can_renegotiate(const SSL *)");
    }
  }
  else {
switchD_00156128_caseD_0:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool ssl_can_renegotiate(const SSL *ssl) {
  if (ssl->server || SSL_is_dtls(ssl)) {
    return false;
  }

  if (ssl->s3->version != 0  //
      && ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
    return false;
  }

  // The config has already been shed.
  if (!ssl->config) {
    return false;
  }

  switch (ssl->renegotiate_mode) {
    case ssl_renegotiate_ignore:
    case ssl_renegotiate_never:
      return false;

    case ssl_renegotiate_freely:
    case ssl_renegotiate_explicit:
      return true;
    case ssl_renegotiate_once:
      return ssl->s3->total_renegotiations == 0;
  }

  assert(0);
  return false;
}